

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

void duckdb::PushCollations
               (ClientContext *context,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children,CollationType type)

{
  bool bVar1;
  ulong uVar2;
  LogicalType *source;
  ClientContext *context_00;
  undefined8 in_RDX;
  LogicalType *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *arg;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  LogicalType collation_type;
  string collation;
  undefined4 in_stack_ffffffffffffff08;
  CollationType in_stack_ffffffffffffff0c;
  LogicalType *in_stack_ffffffffffffff10;
  LogicalType *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff58;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_a0;
  undefined8 local_98;
  string local_80 [56];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_40 [40];
  undefined8 local_18;
  LogicalType *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  ExtractCollation((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::string(local_80,local_40);
    LogicalType::VARCHAR_COLLATION(in_stack_ffffffffffffff58);
    ::std::__cxx11::string::~string(local_80);
    bVar1 = RequiresCollationPropagation(in_stack_ffffffffffffff10);
    if (bVar1) {
      LogicalType::operator=(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    local_98 = local_18;
    local_a0._M_current =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
         ::std::
         vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar1 = __gnu_cxx::
                   operator!=<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
          bVar1) {
      source = (LogicalType *)
               __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               ::operator*(&local_a0);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_ffffffffffffff10);
      bVar1 = RequiresCollationPropagation(in_stack_ffffffffffffff10);
      if (bVar1) {
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_ffffffffffffff10);
        LogicalType::operator=(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
      in_stack_ffffffffffffff10 = local_8;
      context_00 = (ClientContext *)
                   unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_8);
      ExpressionBinder::PushCollation
                (context_00,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 source,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
      ::operator++(&local_a0);
      in_stack_ffffffffffffff18 = source;
    }
    LogicalType::~LogicalType((LogicalType *)0x2a57572);
  }
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void PushCollations(ClientContext &context, ScalarFunction &bound_function, vector<unique_ptr<Expression>> &children,
                    CollationType type) {
	auto collation = ExtractCollation(children);
	if (collation.empty()) {
		// no collation to push
		return;
	}
	// push collation into the return type if required
	auto collation_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
	if (RequiresCollationPropagation(bound_function.return_type)) {
		bound_function.return_type = collation_type;
	}
	// push collations to the children
	for (auto &arg : children) {
		if (RequiresCollationPropagation(arg->return_type)) {
			// if this is a varchar type - propagate the collation
			arg->return_type = collation_type;
		}
		// now push the actual collation handling
		ExpressionBinder::PushCollation(context, arg, arg->return_type, type);
	}
}